

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle lightSampler,Vertex *path,bool regularize)

{
  float fVar1;
  Interval IVar2;
  ulong uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  ulong uVar14;
  DebugMLTSampler *pDVar15;
  PowerLightSampler *this;
  undefined4 uVar16;
  ScratchBuffer *pSVar17;
  uint *puVar18;
  undefined1 auVar19 [16];
  Float FVar20;
  undefined1 auVar21 [16];
  Tuple2<pbrt::Point2,_float> u2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar22 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  SampledSpectrum beta;
  optional<pbrt::SampledLight> sampledLight;
  undefined1 local_2e8 [16];
  LightHandle light;
  optional<pbrt::LightLeSample> les;
  RayDifferential ray;
  LightSamplerHandle local_190;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_188;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_180;
  undefined1 local_178 [40];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  uintptr_t uStack_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined8 uStack_cc;
  undefined8 uStack_c4;
  undefined8 uStack_bc;
  uint uStack_b4;
  undefined4 local_b0;
  undefined8 uStack_ac;
  undefined4 uStack_a4;
  undefined4 local_a0;
  RayDifferential local_98;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar19 = in_ZMM1._0_16_;
  if (maxDepth == 0) {
    iVar12 = 0;
  }
  else {
    local_150.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    pSVar17 = scratchBuffer;
    FVar20 = DispatchSplit<9>::operator()
                       ((DispatchSplit<9> *)&les,&local_150,local_150.bits >> 0x30);
    uVar16 = SUB84(pSVar17,0);
    uVar3 = *(ulong *)lightSampler.
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
    this = (PowerLightSampler *)(uVar3 & 0xffffffffffff);
    if ((uVar3 >> 0x30 < 3) && ((short)(uVar3 >> 0x30) == 2)) {
      PowerLightSampler::Sample(&sampledLight,this,FVar20);
    }
    else {
      sVar4 = (this->lights).nStored;
      if (sVar4 == 0) {
        sampledLight.optionalValue._0_12_ = ZEXT412(0);
        sampledLight.optionalValue._12_4_ = 0;
        sampledLight.set = false;
        sampledLight._17_7_ = 0;
      }
      else {
        auVar19 = vcvtusi2ss_avx512f(auVar19,sVar4);
        iVar13 = (int)(FVar20 * auVar19._0_4_);
        iVar12 = (int)sVar4 + -1;
        if (iVar13 <= iVar12) {
          iVar12 = iVar13;
        }
        sampledLight.set = true;
        sampledLight.optionalValue._8_4_ = 1.0 / auVar19._0_4_;
        sampledLight.optionalValue.__align =
             (anon_struct_8_0_00000001_for___align)
             (this->lights).ptr[iVar12].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
      }
    }
    iVar12 = 0;
    if (sampledLight.set == true) {
      light.
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 )sampledLight.optionalValue.__align;
      uVar8 = sampledLight.optionalValue._8_4_;
      uVar3 = (sampler->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
      pDVar15 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
      uVar7 = (ushort)(uVar3 >> 0x30);
      if (uVar3 >> 0x30 < 5) {
        if (uVar3 < 0x3000000000000) {
          if (uVar7 == 2) {
            local_2e8._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar15);
          }
          else {
            local_2e8._0_8_ = RandomSampler::Get2D((RandomSampler *)pDVar15);
          }
        }
        else if (uVar7 == 3) {
          local_2e8._0_8_ = HaltonSampler::Get2D((HaltonSampler *)pDVar15);
        }
        else {
          local_2e8._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar15);
        }
      }
      else if (uVar7 < 7) {
        if (uVar7 == 6) {
          local_2e8._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)pDVar15);
        }
        else {
          local_2e8._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar15);
        }
      }
      else if (uVar3 >> 0x30 == 8) {
        local_2e8._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar15);
      }
      else if (uVar7 == 7) {
        local_2e8._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar15);
      }
      else {
        local_2e8._0_4_ = DebugMLTSampler::Get1D(pDVar15);
        local_2e8._4_4_ = extraout_XMM0_Db;
        local_2e8._8_4_ = extraout_XMM0_Dc;
        local_2e8._12_4_ = extraout_XMM0_Dd;
        auVar22._0_4_ = DebugMLTSampler::Get1D(pDVar15);
        auVar22._4_60_ = extraout_var;
        auVar19 = vinsertps_avx(local_2e8,auVar22._0_16_,0x10);
        local_2e8._0_8_ = auVar19._0_8_;
      }
      uVar3 = (sampler->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
      pDVar15 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
      uVar7 = (ushort)(uVar3 >> 0x30);
      if (uVar3 < 0x5000000000000) {
        if (uVar3 < 0x3000000000000) {
          if (uVar7 == 2) {
            u2 = (Tuple2<pbrt::Point2,_float>)StratifiedSampler::Get2D((StratifiedSampler *)pDVar15)
            ;
          }
          else {
            u2 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)pDVar15);
          }
        }
        else if (uVar7 == 3) {
          u2 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)pDVar15);
        }
        else {
          u2 = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar15)
          ;
        }
      }
      else if (uVar7 < 7) {
        if (uVar7 == 6) {
          u2 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)pDVar15);
        }
        else {
          u2 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar15);
        }
      }
      else if (uVar3 >> 0x30 == 8) {
        u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar15);
      }
      else if (uVar7 == 7) {
        u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar15);
      }
      else {
        FVar20 = DebugMLTSampler::Get1D(pDVar15);
        auVar23._0_4_ = DebugMLTSampler::Get1D(pDVar15);
        auVar23._4_60_ = extraout_var_00;
        auVar19._4_4_ = extraout_XMM0_Db_00;
        auVar19._0_4_ = FVar20;
        auVar19._8_4_ = extraout_XMM0_Dc_00;
        auVar19._12_4_ = extraout_XMM0_Dd_00;
        auVar19 = vinsertps_avx(auVar19,auVar23._0_16_,0x10);
        u2 = auVar19._0_8_;
      }
      LightHandle::SampleLe(&les,&light,(Point2f)local_2e8._0_8_,(Point2f)u2,lambda,time);
      uVar10 = ray._40_4_;
      iVar12 = 0;
      if (((les.set == true) &&
          ((iVar12 = 0, (float)les.optionalValue._144_4_ != 0.0 ||
           (NAN((float)les.optionalValue._144_4_))))) &&
         (((float)les.optionalValue._148_4_ != 0.0 || (NAN((float)les.optionalValue._148_4_))))) {
        if (((float)les.optionalValue._0_4_ == 0.0) && (!NAN((float)les.optionalValue._0_4_))) {
          uVar3 = 0;
          while (uVar14 = uVar3, uVar14 != 3) {
            fVar24 = *(float *)((long)&les.optionalValue + uVar14 * 4 + 4);
            if ((fVar24 != 0.0) || (uVar3 = uVar14 + 1, NAN(fVar24))) break;
          }
          if (2 < uVar14) {
            return 0;
          }
        }
        ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)les.optionalValue._32_4_;
        ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)les.optionalValue._36_4_;
        ray.super_Ray.time = (Float)les.optionalValue._40_4_;
        uVar9 = ray.super_Ray._20_8_;
        ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)les.optionalValue._16_4_;
        ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)les.optionalValue._20_4_;
        ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)les.optionalValue._28_4_;
        ray.super_Ray.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )les.optionalValue._48_8_;
        ray._40_4_ = ray._40_4_ & 0xffffff00;
        ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_ = SUB168(ZEXT816(0) << 0x40,4);
        ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
        ray.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        ray.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        ray.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        ray.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        ray.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        if (les.optionalValue.__data[0x88] == '\x01') {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = les.optionalValue._56_8_;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = les.optionalValue._64_8_;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = les.optionalValue._72_8_;
          local_178._12_4_ = les.optionalValue._96_4_;
          local_178._8_4_ = les.optionalValue._92_4_;
          local_178._20_4_ = les.optionalValue._104_4_;
          local_178._16_4_ = les.optionalValue._100_4_;
          local_178._0_8_ = les.optionalValue._84_8_;
          local_178._24_8_ = les.optionalValue._108_8_;
          uVar16 = les.optionalValue._116_4_;
        }
        else {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = les.optionalValue._16_8_;
          ray.super_Ray.time = (Float)((ulong)les.optionalValue._36_8_ >> 0x20);
          uVar26 = (undefined4)les.optionalValue._16_8_;
          auVar30._4_4_ = uVar26;
          auVar30._0_4_ = uVar26;
          auVar30._8_4_ = uVar26;
          auVar30._12_4_ = uVar26;
          auVar31 = vmovshdup_avx(auVar28);
          auVar27._4_4_ = les.optionalValue._24_4_;
          auVar27._0_4_ = les.optionalValue._24_4_;
          auVar27._8_4_ = les.optionalValue._24_4_;
          auVar27._12_4_ = les.optionalValue._24_4_;
          local_178._0_32_ = ZEXT1632(ZEXT816(0) << 0x40);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = les.optionalValue._48_8_;
          les.optionalValue._120_16_ = vpslldq_avx(auVar29,8);
          les.optionalValue._80_4_ = ray.super_Ray.time;
        }
        auVar11 = local_178._0_32_;
        auVar19 = vmovlhps_avx(auVar30,auVar31);
        local_b0 = 0;
        uStack_ac = 0;
        uStack_a4 = 0;
        local_a0 = 0;
        path->type = Light;
        *(ulong *)(path->beta).values.values =
             CONCAT44(les.optionalValue._4_4_,les.optionalValue._0_4_);
        *(ulong *)((path->beta).values.values + 2) =
             CONCAT44(les.optionalValue._12_4_,les.optionalValue._8_4_);
        *(undefined1 (*) [16])&path->field_2 = auVar19;
        IVar2 = (Interval)vmovlps_avx(auVar27);
        (path->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar2;
        (path->field_2).ei.super_Interaction.time = (Float)les.optionalValue._80_4_;
        (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x =
             (float)local_178._0_4_;
        (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)local_178._4_4_;
        *(undefined8 *)&(path->field_2).ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z
             = local_178._8_8_;
        (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y =
             (float)local_178._16_4_;
        (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.z =
             (float)local_178._20_4_;
        (path->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float> =
             (Tuple2<pbrt::Point2,_float>)local_178._24_8_;
        *(undefined4 *)&(path->field_2).ei.super_Interaction.field_0x3c = uVar16;
        *(undefined1 (*) [16])((long)&path->field_2 + 0x40) = les.optionalValue._120_16_;
        (path->field_2).mi.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
             (uintptr_t)
             light.
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
        *(uintptr_t *)((long)&path->field_2 + 0x58) = local_150.bits;
        *(undefined8 *)((long)&path->field_2 + 0x60) = uStack_148;
        *(undefined8 *)((long)&path->field_2 + 0x68) = uStack_140;
        *(undefined8 *)((long)&path->field_2 + 0x70) = uStack_138;
        *(undefined8 *)((long)&path->field_2 + 0x78) = uStack_130;
        *(undefined8 *)((long)&path->field_2 + 0x80) = uStack_128;
        *(undefined8 *)((long)&path->field_2 + 0x88) = uStack_120;
        *(undefined8 *)((long)&path->field_2 + 0x90) = uStack_118;
        *(undefined8 *)((long)&path->field_2 + 0x98) = local_110;
        *(undefined8 *)((long)&path->field_2 + 0xa0) = uStack_108;
        *(undefined8 *)((long)&path->field_2 + 0xa8) = uStack_100;
        *(undefined8 *)((long)&path->field_2 + 0xb0) = uStack_f8;
        *(undefined8 *)((long)&path->field_2 + 0xb8) = uStack_f0;
        (path->field_2).si.material.
        super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        .bits = uStack_e8;
        (path->field_2).si.areaLight.
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits = CONCAT44(uStack_dc,uStack_e0);
        *(ulong *)((long)&path->field_2 + 0xd0) = CONCAT44(uStack_d4,uStack_d8);
        *(ulong *)((long)&(path->field_2).si.areaLight.
                          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                          .bits + 4) = CONCAT44(uStack_d8,uStack_dc);
        *(ulong *)((long)&path->field_2 + 0xd4) = CONCAT44(uStack_d0,uStack_d4);
        *(undefined8 *)((long)&path->field_2 + 0xdc) = uStack_cc;
        *(undefined8 *)((long)&path->field_2 + 0xe4) = uStack_c4;
        *(undefined8 *)((long)&path->field_2 + 0xec) = uStack_bc;
        *(ulong *)((long)&path->field_2 + 0xf4) = (ulong)uStack_b4;
        *(undefined8 *)
         ((long)&(path->bsdf).bxdf.
                 super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                 .bits + 4) = 0;
        (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
        (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
        (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
        (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        *(undefined8 *)&(path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
        (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
        (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
        path->delta = false;
        path->pdfFwd = (float)les.optionalValue._144_4_ * (float)uVar8;
        path->pdfRev = 0.0;
        if (les.optionalValue.__data[0x88] == '\x01') {
          ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)les.optionalValue._36_8_;
          auVar19 = vfmadd132ss_fma(ZEXT416((uint)les.optionalValue._100_4_),
                                    ZEXT416((uint)((float)les.optionalValue._104_4_ *
                                                  ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                                  .z)),ZEXT416((uint)les.optionalValue._32_4_));
          auVar31 = vfmsub213ss_fma(ZEXT416((uint)ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                                  .z),ZEXT416((uint)les.optionalValue._104_4_),
                                    ZEXT416((uint)((float)les.optionalValue._104_4_ *
                                                  ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                                  .z)));
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar31._0_4_)),
                                    ZEXT416((uint)les.optionalValue._96_4_),
                                    ZEXT416((uint)les.optionalValue._28_4_));
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar19 = vandps_avx512vl(auVar19,auVar5);
          fVar24 = auVar19._0_4_;
        }
        else {
          fVar24 = 1.0;
        }
        auVar25._0_4_ = fVar24 * (float)les.optionalValue._0_4_;
        auVar25._4_4_ = fVar24 * (float)les.optionalValue._4_4_;
        auVar25._8_4_ = fVar24 * (float)les.optionalValue._8_4_;
        auVar25._12_4_ = fVar24 * (float)les.optionalValue._12_4_;
        fVar24 = (float)les.optionalValue._144_4_ * (float)uVar8 * (float)les.optionalValue._148_4_;
        auVar21._4_4_ = fVar24;
        auVar21._0_4_ = fVar24;
        auVar21._8_4_ = fVar24;
        auVar21._12_4_ = fVar24;
        auVar19 = vdivps_avx(auVar25,auVar21);
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)les.optionalValue._16_4_;
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)les.optionalValue._20_4_;
        local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)les.optionalValue._36_4_;
        local_98.super_Ray.time = (Float)les.optionalValue._40_4_;
        local_98.super_Ray.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )les.optionalValue._48_8_;
        local_98._40_8_ = (ulong)(uint)uVar10 & 0xffffffffffffff00;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_180.bits =
             (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        local_188.bits =
             (camera->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits;
        auVar31 = vshufpd_avx(auVar19,auVar19,1);
        beta.values.values._0_8_ = auVar19._0_8_;
        beta.values.values._8_8_ = auVar31._0_8_;
        ray.super_Ray._20_8_ = uVar9;
        ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        ray.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
             ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        local_178._0_32_ = auVar11;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z =
             ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
        iVar12 = RandomWalk(integrator,lambda,&local_98,(SamplerHandle *)&local_180,
                            (CameraHandle *)&local_188,scratchBuffer,beta,
                            (Float)les.optionalValue._148_4_,maxDepth + -1,Importance,path + 1,
                            regularize);
        if ((path->type == Light) &&
           ((puVar18 = (uint *)((ulong)(path->field_2).ei.field_0 & 0xffffffffffff),
            puVar18 == (uint *)0x0 || ((*puVar18 & 0xfffffffd) == 1)))) {
          if (0 < iVar12) {
            if (les.set == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            path[1].pdfFwd = (Float)les.optionalValue._144_4_;
            fVar24 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
            if ((((fVar24 != 0.0) ||
                 (fVar1 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.
                          y, fVar1 != 0.0)) || (NAN(fVar1))) ||
               ((fVar1 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z
                , fVar1 != 0.0 || (NAN(fVar1))))) {
              fVar1 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
              auVar31 = ZEXT416((uint)(fVar1 * ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z)
                               );
              auVar19 = vfmadd132ss_fma(ZEXT416((uint)path[1].field_2.ei.super_Interaction.n.
                                                      super_Tuple3<pbrt::Normal3,_float>.y),auVar31,
                                        ZEXT416((uint)ray.super_Ray.d.
                                                      super_Tuple3<pbrt::Vector3,_float>.y));
              auVar31 = vfmsub213ss_fma(ZEXT416((uint)ray.super_Ray.d.
                                                      super_Tuple3<pbrt::Vector3,_float>.z),
                                        ZEXT416((uint)fVar1),auVar31);
              auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar31._0_4_)),
                                        ZEXT416((uint)fVar24),
                                        ZEXT416((uint)ray.super_Ray.d.
                                                      super_Tuple3<pbrt::Vector3,_float>.x));
              auVar6._8_4_ = 0x7fffffff;
              auVar6._0_8_ = 0x7fffffff7fffffff;
              auVar6._12_4_ = 0x7fffffff;
              auVar19 = vandps_avx512vl(auVar19,auVar6);
              path[1].pdfFwd = (float)les.optionalValue._144_4_ * auVar19._0_4_;
            }
          }
          local_190.
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                    *)lightSampler.
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
          FVar20 = InfiniteLightDensity(&integrator->infiniteLights,&local_190,&ray.super_Ray.d);
          path->pdfFwd = FVar20;
        }
        iVar12 = iVar12 + 1;
      }
    }
  }
  return iVar12;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    // Generate light subpath and initialize _path_ vertices
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    // Sample light for BDPT light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightSamplePDF = sampledLight->pdf;

    Point2f ul0 = sampler.Get2D();
    Point2f ul1 = sampler.Get2D();
    pstd::optional<LightLeSample> les = light.SampleLe(ul0, ul1, lambda, time);
    if (!les || les->pdfPos == 0 || les->pdfDir == 0 || !les->L)
        return 0;
    RayDifferential ray(les->ray);

    // Generate first vertex of light subpath
    Float lightPDF = lightSamplePDF * les->pdfPos;
    path[0] = les->intr ? Vertex::CreateLight(light, *les->intr, les->L, lightPDF)
                        : Vertex::CreateLight(light, ray, les->L, lightPDF);

    // Follow light subpath random walk
    SampledSpectrum beta = les->L * les->AbsCosTheta(ray.d) / (lightPDF * les->pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les->L, beta, les->pdfPos, les->pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les->pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les->pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}